

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltIns::addSamplingFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  TBasicType local_94;
  undefined1 local_80 [4];
  TBasicType t;
  TString s;
  int sparse;
  int lodClamp;
  int f16TexAddr;
  int totalDims;
  int iStack_40;
  bool compare;
  int extraProj;
  int grad;
  int fetch;
  int offset;
  int bias;
  int lod;
  int proj;
  EProfile profile_local;
  int version_local;
  TString *typeName_local;
  TBuiltIns *this_local;
  TSampler sampler_local;
  
  bias = 0;
  this_local._4_4_ = sampler;
  do {
    if (1 < bias) {
      return;
    }
    if ((bias == 0) ||
       ((((((uint)this_local._4_4_ >> 8 & 0xff) != 4 &&
          (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), !bVar1)) &&
         (((uint)this_local._4_4_ >> 0x10 & 1) == 0)) &&
        ((bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1 &&
         (bVar1 = TSampler::isCombined((TSampler *)((long)&this_local + 4)), bVar1)))))) {
      for (offset = 0; offset < 2; offset = offset + 1) {
        if (((offset == 0) ||
            (((bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), !bVar1 &&
              (bVar1 = TSampler::isRect((TSampler *)((long)&this_local + 4)), !bVar1)) &&
             ((bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1 &&
              (bVar1 = TSampler::isCombined((TSampler *)((long)&this_local + 4)), bVar1)))))) &&
           (((((offset == 0 || (((uint)this_local._4_4_ >> 8 & 0xff) != 2)) ||
              (((uint)this_local._4_4_ >> 0x10 & 1) == 0)) ||
             (((uint)this_local._4_4_ >> 0x11 & 1) == 0)) &&
            (((offset == 0 || (((uint)this_local._4_4_ >> 8 & 0xff) != 4)) ||
             (((uint)this_local._4_4_ >> 0x11 & 1) == 0)))))) {
          for (fetch = 0; fetch < 2; fetch = fetch + 1) {
            if (((fetch == 0) ||
                (((offset == 0 &&
                  (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1)) &&
                 (bVar1 = TSampler::isCombined((TSampler *)((long)&this_local + 4)), bVar1)))) &&
               ((((fetch == 0 ||
                  (((((uint)this_local._4_4_ >> 8 & 0xff) != 2 &&
                    (((uint)this_local._4_4_ >> 8 & 0xff) != 4)) ||
                   (((uint)this_local._4_4_ >> 0x11 & 1) == 0)))) ||
                 (((uint)this_local._4_4_ >> 0x10 & 1) == 0)) &&
                ((fetch == 0 ||
                 ((bVar1 = TSampler::isRect((TSampler *)((long)&this_local + 4)), !bVar1 &&
                  (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), !bVar1)))))))) {
              for (grad = 0; grad < 2; grad = grad + 1) {
                if ((bias + grad + fetch + offset < 4) &&
                   ((grad == 0 ||
                    (((((uint)this_local._4_4_ >> 8 & 0xff) != 4 &&
                      (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), !bVar1)) &&
                     (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1))
                    )))) {
                  for (extraProj = 0; extraProj < 2; extraProj = extraProj + 1) {
                    if (((bias + grad + extraProj + fetch + offset < 4) &&
                        ((extraProj == 0 || ((offset == 0 && (fetch == 0)))))) &&
                       (((extraProj == 0 ||
                         ((((uint)this_local._4_4_ >> 0x11 & 1) == 0 &&
                          (((uint)this_local._4_4_ >> 8 & 0xff) != 4)))) &&
                        ((extraProj != 0 ||
                         (((bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)),
                           !bVar1 && (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)
                                                                ), !bVar1)) &&
                          (bVar1 = TSampler::isCombined((TSampler *)((long)&this_local + 4)), bVar1)
                          ))))))) {
                      for (iStack_40 = 0; iStack_40 < 2; iStack_40 = iStack_40 + 1) {
                        if (((iStack_40 == 0) ||
                            (((offset == 0 && (fetch == 0)) &&
                             ((bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)),
                              !bVar1 && (bVar1 = TSampler::isCombined
                                                           ((TSampler *)((long)&this_local + 4)),
                                        bVar1)))))) &&
                           (((iStack_40 == 0 ||
                             (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)),
                             !bVar1)) && (bias + grad + extraProj + iStack_40 + fetch + offset < 4))
                           )) {
                          for (totalDims = 0; totalDims < 2; totalDims = totalDims + 1) {
                            bVar1 = false;
                            lodClamp = this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff] +
                                       (uint)(((uint)this_local._4_4_ & 0x10000) != 0);
                            if ((((uint)this_local._4_4_ >> 0x11 & 1) != 0) && (lodClamp < 2)) {
                              lodClamp = 2;
                            }
                            lodClamp = (uint)(((uint)this_local._4_4_ >> 0x11 & 1) != 0) + bias +
                                       lodClamp;
                            if ((4 < lodClamp) && (((uint)this_local._4_4_ >> 0x11 & 1) != 0)) {
                              bVar1 = true;
                              lodClamp = 4;
                            }
                            if (4 < lodClamp) {
                              __assert_fail("totalDims <= 4",
                                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Initialize.cpp"
                                            ,0x1c68,
                                            "void glslang::TBuiltIns::addSamplingFunctions(TSampler, const TString &, int, EProfile)"
                                           );
                            }
                            if (((totalDims == 0) || (bias != 0)) &&
                               ((totalDims == 0 ||
                                (((((uint)this_local._4_4_ >> 8 & 0xff) != 3 &&
                                  (((uint)this_local._4_4_ >> 0x11 & 1) == 0)) &&
                                 (bVar2 = TSampler::isCombined((TSampler *)((long)&this_local + 4)),
                                 bVar2)))))) {
                              for (sparse = 0; sparse < 2; sparse = sparse + 1) {
                                if ((sparse == 0) || (((uint)this_local._4_4_ & 0xff) == 3)) {
                                  if ((sparse != 0) &&
                                     ((((uint)this_local._4_4_ >> 0x11 & 1) != 0 && (!bVar1)))) {
                                    bVar1 = true;
                                    lodClamp = lodClamp + -1;
                                  }
                                  for (s.field_2._12_4_ = 0; (int)s.field_2._12_4_ < 2;
                                      s.field_2._12_4_ = s.field_2._12_4_ + 1) {
                                    if (((s.field_2._12_4_ == 0) ||
                                        ((profile != EEsProfile && (0x1c1 < version)))) &&
                                       ((s.field_2._12_4_ == 0 ||
                                        (((bias == 0 && (offset == 0)) && (extraProj == 0)))))) {
                                      for (s.field_2._8_4_ = 0; (int)s.field_2._8_4_ < 2;
                                          s.field_2._8_4_ = s.field_2._8_4_ + 1) {
                                        if (((s.field_2._8_4_ == 0) ||
                                            ((profile != EEsProfile && (0x1c1 < version)))) &&
                                           ((s.field_2._8_4_ == 0 ||
                                            (((bVar2 = TSampler::is1D((TSampler *)
                                                                      ((long)&this_local + 4)),
                                              !bVar2 && (bVar2 = TSampler::isBuffer((TSampler *)
                                                                                    ((long)&
                                                  this_local + 4)), !bVar2)) && (bias == 0)))))) {
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::basic_string((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80);
                                          if (s.field_2._8_4_ == 0) {
                                            if (((uint)this_local._4_4_ >> 0x11 & 1) == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,
                                                  this->prefixes[(uint)this_local._4_4_ & 0xff]);
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"vec4 ");
                                            }
                                            else if (((uint)this_local._4_4_ & 0xff) == 3) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"float16_t ");
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"float ");
                                            }
                                          }
                                          else {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"int ");
                                          }
                                          if (s.field_2._8_4_ == 0) {
                                            if (extraProj == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"texture");
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"texel");
                                            }
                                          }
                                          else if (extraProj == 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"sparseTexture");
                                          }
                                          else {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"sparseTexel");
                                          }
                                          if (bias != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"Proj");
                                          }
                                          if (offset != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"Lod");
                                          }
                                          if (iStack_40 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"Grad");
                                          }
                                          if (extraProj != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"Fetch");
                                          }
                                          if (grad != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"Offset");
                                          }
                                          if (s.field_2._12_4_ != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"Clamp");
                                          }
                                          if ((s.field_2._12_4_ != 0) || (s.field_2._8_4_ != 0)) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"ARB");
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"(");
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,typeName);
                                          if (totalDims == 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",");
                                            if (extraProj == 0) {
                                              local_94 = EbtFloat;
                                              if (sparse != 0) {
                                                local_94 = EbtFloat16;
                                              }
                                            }
                                            else {
                                              local_94 = EbtInt;
                                            }
                                            if (lodClamp == 1) {
                                              __s = TType::getBasicString(local_94);
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,__s);
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,this->prefixes[local_94]);
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"vec");
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,this->postfixes[lodClamp]);
                                            }
                                          }
                                          else if (sparse == 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",vec4");
                                          }
                                          else {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",f16vec4");
                                          }
                                          if (bVar1) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float");
                                          }
                                          if (((((extraProj != 0) &&
                                                (bVar2 = TSampler::isBuffer((TSampler *)
                                                                            ((long)&this_local + 4))
                                                , !bVar2)) &&
                                               (bVar2 = TSampler::isRect((TSampler *)
                                                                         ((long)&this_local + 4)),
                                               !bVar2)) &&
                                              (bVar2 = TSampler::isMultiSample
                                                                 ((TSampler *)
                                                                  ((long)&this_local + 4)), !bVar2))
                                             || ((bVar2 = TSampler::isMultiSample
                                                                    ((TSampler *)
                                                                     ((long)&this_local + 4)), bVar2
                                                 && (extraProj != 0)))) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",int");
                                          }
                                          if (offset != 0) {
                                            if (sparse == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float");
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float16_t");
                                            }
                                          }
                                          if (iStack_40 != 0) {
                                            if (this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff] ==
                                                1) {
                                              if (sparse == 0) {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float,float");
                                              }
                                              else {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float16_t,float16_t");
                                              }
                                            }
                                            else {
                                              if (sparse == 0) {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",vec");
                                              }
                                              else {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",f16vec");
                                              }
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,
                                                  this->postfixes
                                                  [this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff]]
                                                  );
                                              if (sparse == 0) {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",vec");
                                              }
                                              else {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",f16vec");
                                              }
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,
                                                  this->postfixes
                                                  [this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff]]
                                                  );
                                            }
                                          }
                                          if (grad != 0) {
                                            if (this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff] ==
                                                1) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",int");
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",ivec");
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,
                                                  this->postfixes
                                                  [this->dimMap[(uint)this_local._4_4_ >> 8 & 0xff]]
                                                  );
                                            }
                                          }
                                          if (s.field_2._12_4_ != 0) {
                                            if (sparse == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float");
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float16_t");
                                            }
                                          }
                                          if (s.field_2._8_4_ != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",out ");
                                            if (((uint)this_local._4_4_ >> 0x11 & 1) == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,
                                                  this->prefixes[(uint)this_local._4_4_ & 0xff]);
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"vec4");
                                            }
                                            else if (((uint)this_local._4_4_ & 0xff) == 3) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"float16_t");
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,"float");
                                            }
                                          }
                                          if (fetch != 0) {
                                            if (sparse == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float");
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,",float16_t");
                                            }
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80,");\n");
                                          if ((iStack_40 == 0) &&
                                             ((fetch != 0 || (s.field_2._12_4_ != 0)))) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((this->super_TBuiltInParseables).stageBuiltins
                                                     + 4,(
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80);
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append((this->super_TBuiltInParseables).stageBuiltins
                                                     + 5,(
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80);
                                          }
                                          else {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&(this->super_TBuiltInParseables).
                                                      commonBuiltins,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80);
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::~basic_string((
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  *)local_80);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bias = bias + 1;
  } while( true );
}

Assistant:

void TBuiltIns::addSamplingFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // texturing
    //
    for (int proj = 0; proj <= 1; ++proj) { // loop over "bool" projective or not

        if (proj && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.arrayed || sampler.isMultiSample()
            || !sampler.isCombined()))
            continue;

        for (int lod = 0; lod <= 1; ++lod) {

            if (lod && (sampler.isBuffer() || sampler.isRect() || sampler.isMultiSample() || !sampler.isCombined()))
                continue;
            if (lod && sampler.dim == Esd2D && sampler.arrayed && sampler.shadow)
                continue;
            if (lod && sampler.dim == EsdCube && sampler.shadow)
                continue;

            for (int bias = 0; bias <= 1; ++bias) {

                if (bias && (lod || sampler.isMultiSample() || !sampler.isCombined()))
                    continue;
                if (bias && (sampler.dim == Esd2D || sampler.dim == EsdCube) && sampler.shadow && sampler.arrayed)
                    continue;
                if (bias && (sampler.isRect() || sampler.isBuffer()))
                    continue;

                for (int offset = 0; offset <= 1; ++offset) { // loop over "bool" offset or not

                    if (proj + offset + bias + lod > 3)
                        continue;
                    if (offset && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.isMultiSample()))
                        continue;

                    for (int fetch = 0; fetch <= 1; ++fetch) { // loop over "bool" fetch or not

                        if (proj + offset + fetch + bias + lod > 3)
                            continue;
                        if (fetch && (lod || bias))
                            continue;
                        if (fetch && (sampler.shadow || sampler.dim == EsdCube))
                            continue;
                        if (fetch == 0 && (sampler.isMultiSample() || sampler.isBuffer()
                            || !sampler.isCombined()))
                            continue;

                        for (int grad = 0; grad <= 1; ++grad) { // loop over "bool" grad or not

                            if (grad && (lod || bias || sampler.isMultiSample() || !sampler.isCombined()))
                                continue;
                            if (grad && sampler.isBuffer())
                                continue;
                            if (proj + offset + fetch + grad + bias + lod > 3)
                                continue;

                            for (int extraProj = 0; extraProj <= 1; ++extraProj) {
                                bool compare = false;
                                int totalDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0);
                                // skip dummy unused second component for 1D non-array shadows
                                if (sampler.shadow && totalDims < 2)
                                    totalDims = 2;
                                totalDims += (sampler.shadow ? 1 : 0) + proj;
                                if (totalDims > 4 && sampler.shadow) {
                                    compare = true;
                                    totalDims = 4;
                                }
                                assert(totalDims <= 4);

                                if (extraProj && ! proj)
                                    continue;
                                if (extraProj && (sampler.dim == Esd3D || sampler.shadow || !sampler.isCombined()))
                                    continue;

                                // loop over 16-bit floating-point texel addressing
                                for (int f16TexAddr = 0; f16TexAddr <= 1; ++f16TexAddr)
                                {
                                    if (f16TexAddr && sampler.type != EbtFloat16)
                                        continue;
                                    if (f16TexAddr && sampler.shadow && ! compare) {
                                        compare = true; // compare argument is always present
                                        totalDims--;
                                    }
                                    // loop over "bool" lod clamp
                                    for (int lodClamp = 0; lodClamp <= 1 ;++lodClamp)
                                    {
                                        if (lodClamp && (profile == EEsProfile || version < 450))
                                            continue;
                                        if (lodClamp && (proj || lod || fetch))
                                            continue;

                                        // loop over "bool" sparse or not
                                        for (int sparse = 0; sparse <= 1; ++sparse)
                                        {
                                            if (sparse && (profile == EEsProfile || version < 450))
                                                continue;
                                            // Sparse sampling is not for 1D/1D array texture, buffer texture, and
                                            // projective texture
                                            if (sparse && (sampler.is1D() || sampler.isBuffer() || proj))
                                                continue;

                                            TString s;

                                            // return type
                                            if (sparse)
                                                s.append("int ");
                                            else {
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t ");
                                                    else
                                                        s.append("float ");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4 ");
                                                }
                                            }

                                            // name
                                            if (sparse) {
                                                if (fetch)
                                                    s.append("sparseTexel");
                                                else
                                                    s.append("sparseTexture");
                                            }
                                            else {
                                                if (fetch)
                                                    s.append("texel");
                                                else
                                                    s.append("texture");
                                            }
                                            if (proj)
                                                s.append("Proj");
                                            if (lod)
                                                s.append("Lod");
                                            if (grad)
                                                s.append("Grad");
                                            if (fetch)
                                                s.append("Fetch");
                                            if (offset)
                                                s.append("Offset");
                                            if (lodClamp)
                                                s.append("Clamp");
                                            if (lodClamp != 0 || sparse)
                                                s.append("ARB");
                                            s.append("(");

                                            // sampler type
                                            s.append(typeName);
                                            // P coordinate
                                            if (extraProj) {
                                                if (f16TexAddr)
                                                    s.append(",f16vec4");
                                                else
                                                    s.append(",vec4");
                                            } else {
                                                s.append(",");
                                                TBasicType t = fetch ? EbtInt : (f16TexAddr ? EbtFloat16 : EbtFloat);
                                                if (totalDims == 1)
                                                    s.append(TType::getBasicString(t));
                                                else {
                                                    s.append(prefixes[t]);
                                                    s.append("vec");
                                                    s.append(postfixes[totalDims]);
                                                }
                                            }
                                            // non-optional compare
                                            if (compare)
                                                s.append(",float");

                                            // non-optional lod argument (lod that's not driven by lod loop) or sample
                                            if ((fetch && !sampler.isBuffer() &&
                                                 !sampler.isRect() && !sampler.isMultiSample())
                                                 || (sampler.isMultiSample() && fetch))
                                                s.append(",int");
                                            // non-optional lod
                                            if (lod) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }

                                            // gradient arguments
                                            if (grad) {
                                                if (dimMap[sampler.dim] == 1) {
                                                    if (f16TexAddr)
                                                        s.append(",float16_t,float16_t");
                                                    else
                                                        s.append(",float,float");
                                                } else {
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }
                                            // offset
                                            if (offset) {
                                                if (dimMap[sampler.dim] == 1)
                                                    s.append(",int");
                                                else {
                                                    s.append(",ivec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }

                                            // lod clamp
                                            if (lodClamp) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            // texel out (for sparse texture)
                                            if (sparse) {
                                                s.append(",out ");
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t");
                                                    else
                                                        s.append("float");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4");
                                                }
                                            }
                                            // optional bias
                                            if (bias) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            s.append(");\n");

                                            // Add to the per-language set of built-ins
                                            if (!grad && (bias || lodClamp != 0)) {
                                                stageBuiltins[EShLangFragment].append(s);
                                                stageBuiltins[EShLangCompute].append(s);
                                            } else
                                                commonBuiltins.append(s);

                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}